

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e
ktxPrintKTX2InfoJSONForStream
          (ktxStream *stream,ktx_uint32_t base_indent,ktx_uint32_t indent_width,_Bool minified)

{
  int iVar1;
  byte in_CL;
  undefined8 *in_RDI;
  ktx_error_code_e result;
  KTX_header2 header;
  ktx_uint8_t ktx2_ident_ref [12];
  undefined1 local_78 [12];
  undefined1 auStack_6c [71];
  undefined8 local_25;
  undefined4 local_1d;
  byte local_19;
  undefined8 *local_10;
  ktx_error_code_e local_4;
  
  local_19 = in_CL & 1;
  local_25 = 0xbb30322058544bab;
  local_1d = 0xa1a0a0d;
  if (in_RDI == (undefined8 *)0x0) {
    __assert_fail("stream != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,1099,
                  "ktx_error_code_e ktxPrintKTX2InfoJSONForStream(ktxStream *, ktx_uint32_t, ktx_uint32_t, _Bool)"
                 );
  }
  local_10 = in_RDI;
  local_4 = (*(code *)*in_RDI)(in_RDI,local_78,0xc);
  if (local_4 == KTX_SUCCESS) {
    iVar1 = memcmp(local_78,&local_25,0xc);
    if (iVar1 == 0) {
      local_4 = (*(code *)*local_10)(local_10,auStack_6c,0x44);
      if (local_4 == KTX_SUCCESS) {
        local_4 = printKTX2Info2JSON((ktxStream *)header.keyValueData,
                                     (KTX_header2 *)header.dataFormatDescriptor,
                                     header.supercompressionScheme,header.levelCount,
                                     header.faceCount._3_1_);
      }
    }
    else {
      local_4 = KTX_UNKNOWN_FILE_FORMAT;
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoJSONForStream(ktxStream* stream, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    ktx_uint8_t ktx2_ident_ref[12] = KTX2_IDENTIFIER_REF;
    KTX_header2 header;
    KTX_error_code result;

    assert(stream != NULL);

    result = stream->read(stream, &header, sizeof(ktx2_ident_ref));
    if (result != KTX_SUCCESS)
        return result;

    // Compare identifier, is this a KTX2 file?
    if (memcmp(header.identifier, ktx2_ident_ref, 12))
        return KTX_UNKNOWN_FILE_FORMAT;

    // Read rest of header.
    result = stream->read(stream, &header.vkFormat, KTX2_HEADER_SIZE - sizeof(ktx2_ident_ref));
    if (result != KTX_SUCCESS)
        return result;

    result = printKTX2Info2JSON(stream, &header, base_indent, indent_width, minified);
    return result;
}